

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledInputFile.cpp
# Opt level: O0

void __thiscall
Imf_2_5::TiledInputFile::TiledInputFile(TiledInputFile *this,IStream *is,int numThreads)

{
  bool bVar1;
  byte bVar2;
  void *pvVar3;
  _func_int *p_Var4;
  undefined8 uVar5;
  undefined8 in_RSI;
  GenericInputFile *in_RDI;
  size_t i;
  stringstream _iex_replace_s;
  int *in_stack_00000130;
  IStream *in_stack_00000138;
  GenericInputFile *in_stack_00000140;
  BaseExc *e;
  bool streamDataCreated;
  int *in_stack_000003e0;
  IStream *in_stack_000003e8;
  Header *in_stack_000003f0;
  InputStreamMutex *in_stack_fffffffffffffdd0;
  IStream *in_stack_fffffffffffffde8;
  TiledInputFile *in_stack_fffffffffffffdf0;
  undefined1 in_stack_fffffffffffffdfe;
  undefined1 in_stack_fffffffffffffdff;
  bool *in_stack_fffffffffffffe00;
  IStream *in_stack_fffffffffffffe08;
  undefined7 in_stack_fffffffffffffe10;
  undefined1 in_stack_fffffffffffffe17;
  Data *this_00;
  TiledInputFile *in_stack_fffffffffffffe60;
  
  GenericInputFile::GenericInputFile(in_RDI);
  in_RDI->_vptr_GenericInputFile = (_func_int **)&PTR__TiledInputFile_005626a0;
  this_00 = (Data *)(in_RDI + 1);
  pvVar3 = operator_new(0x180);
  Data::Data(this_00,(int)((ulong)in_RDI >> 0x20));
  (this_00->super_Mutex).super___mutex_base._M_mutex.__align = (long)pvVar3;
  *(undefined1 *)(in_RDI[1]._vptr_GenericInputFile + 0x2f) = 0;
  GenericInputFile::readMagicNumberAndVersionField
            (in_stack_00000140,in_stack_00000138,in_stack_00000130);
  bVar1 = isMultiPart(*(int *)(in_RDI[1]._vptr_GenericInputFile + 0xe));
  if (bVar1) {
    compatibilityInitialize(in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
  }
  else {
    p_Var4 = (_func_int *)operator_new(0x38);
    InputStreamMutex::InputStreamMutex(in_stack_fffffffffffffdd0);
    in_RDI[1]._vptr_GenericInputFile[0x2e] = p_Var4;
    *(undefined8 *)(in_RDI[1]._vptr_GenericInputFile[0x2e] + 0x28) = in_RSI;
    Header::readFrom(in_stack_000003f0,in_stack_000003e8,in_stack_000003e0);
    initialize(in_stack_fffffffffffffe60);
    TileOffsets::readFrom
              ((TileOffsets *)CONCAT17(in_stack_fffffffffffffe17,in_stack_fffffffffffffe10),
               in_stack_fffffffffffffe08,in_stack_fffffffffffffe00,(bool)in_stack_fffffffffffffdff,
               (bool)in_stack_fffffffffffffdfe);
    bVar2 = (**(code **)(**(long **)(in_RDI[1]._vptr_GenericInputFile[0x2e] + 0x28) + 0x10))();
    *(byte *)(in_RDI[1]._vptr_GenericInputFile + 0x2d) = bVar2 & 1;
    uVar5 = (**(code **)(**(long **)(in_RDI[1]._vptr_GenericInputFile[0x2e] + 0x28) + 0x28))();
    *(undefined8 *)(in_RDI[1]._vptr_GenericInputFile[0x2e] + 0x30) = uVar5;
  }
  return;
}

Assistant:

TiledInputFile::TiledInputFile (OPENEXR_IMF_INTERNAL_NAMESPACE::IStream &is, int numThreads):
    _data (new Data (numThreads))
{
    _data->_deleteStream=false;
    //
    // This constructor is called when a user
    // explicitly wants to read a tiled file.
    //

    bool streamDataCreated = false;

    try
    {
        try
        {
            readMagicNumberAndVersionField(is, _data->version);

            //
            // Backward compatibility to read multpart file.
            //
            if (isMultiPart(_data->version))
            {
                compatibilityInitialize(is);
                return;
            }

            streamDataCreated = true;
            _data->_streamData = new InputStreamMutex();
            _data->_streamData->is = &is;
            _data->header.readFrom (*_data->_streamData->is, _data->version);
            initialize();
            // file is guaranteed to be single part, regular image
            _data->tileOffsets.readFrom (*(_data->_streamData->is), _data->fileIsComplete,false,false);
            _data->memoryMapped = _data->_streamData->is->isMemoryMapped();
            _data->_streamData->currentPosition = _data->_streamData->is->tellg();
        }
        catch (IEX_NAMESPACE::BaseExc &e)
        {
            REPLACE_EXC (e, "Cannot open image file "
                    "\"" << is.fileName() << "\". " << e.what());
            throw;
        }
    }
    catch (...)
    {
        if (!_data->memoryMapped)
        {
            for (size_t i = 0; i < _data->tileBuffers.size(); i++)
            {
                if( _data->tileBuffers[i])
                {
                   delete [] _data->tileBuffers[i]->buffer;
                }
            }
        }
        if (streamDataCreated) delete _data->_streamData;
	delete _data;
        throw;
    }
}